

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O0

int is_constant(double *x,int N)

{
  double dVar1;
  double tmp;
  double eps;
  int local_20;
  int cst;
  int i;
  int N_local;
  double *x_local;
  
  dVar1 = macheps();
  local_20 = 1;
  while( true ) {
    if (N <= local_20) {
      return 1;
    }
    if (dVar1 < ABS(x[local_20] - x[local_20 + -1])) break;
    local_20 = local_20 + 1;
  }
  return 0;
}

Assistant:

int is_constant(double *x, int N) {
    int i, cst;
    double eps,tmp;

    eps = macheps();
    cst = 1;

    for(i = 1; i < N;++i) {
        tmp = x[i] - x[i-1];
        if (fabs(tmp) > eps) {
            return 0;
        }
    }

    return cst;
}